

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_start_doc(Parser *this,bool as_child)

{
  pfn_error p_Var1;
  ulong uVar2;
  size_t node;
  Tree *this_00;
  size_t i;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  NodeData *pNVar11;
  size_t *psVar12;
  size_t ichild;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  byte bVar16;
  csubstr cVar17;
  char msg [58];
  size_t local_b0;
  size_t local_88;
  size_t local_60;
  size_t local_38;
  
  bVar16 = 0;
  if ((this->m_stack).m_size == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    cVar17 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '_';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    msg._24_4_ = cVar17.str._0_4_;
    msg._28_4_ = cVar17.str._4_4_;
    msg._32_2_ = (undefined2)cVar17.len;
    msg[0x22] = cVar17.len._2_1_;
    msg._35_5_ = cVar17.len._3_5_;
    (*(code *)PTR_error_impl_0022f4f8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar10 = Parser::node(this,(this->m_stack).m_stack);
  pNVar11 = Parser::node(this,this->m_root_id);
  if (pNVar10 != pNVar11) {
    builtin_strncpy(msg + 0x30,"root_id))",10);
    builtin_strncpy(msg + 0x20,"om()) == node(m_",0x10);
    builtin_strncpy(msg + 0x10,"ode(m_stack.bott",0x10);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar17 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar17.len;
    auVar5 = ZEXT1224(ZEXT412(0x775e) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar17.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar17.str._4_4_;
    LVar4.name.len = local_38;
    (*p_Var1)(msg,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar2 = (this->m_stack).m_size;
  psVar12 = &(this->m_stack).m_stack[uVar2 - 2].node_id;
  if (uVar2 < 2) {
    psVar12 = &this->m_root_id;
  }
  node = *psVar12;
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (parent_id != NONE)",0x22);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar17 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar17.len;
    auVar5 = ZEXT1224(ZEXT412(0x7760) << 0x40);
    LVar6.name.str._0_4_ = (int)cVar17.str;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = cVar17.str._4_4_;
    LVar6.name.len = local_60;
    (*p_Var1)(msg,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  bVar9 = Tree::is_root(this->m_tree,node);
  if (!bVar9) {
    builtin_strncpy(msg + 0x20,"arent_id))",0xb);
    builtin_strncpy(msg + 0x10,"_tree->is_root(p",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar17 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_88 = cVar17.len;
    auVar5 = ZEXT1224(ZEXT412(0x7761) << 0x40);
    LVar7.name.str._0_4_ = (int)cVar17.str;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = cVar17.str._4_4_;
    LVar7.name.len = local_88;
    (*p_Var1)(msg,0x2b,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar10 = Parser::node(this,this->m_state);
  if (pNVar10 != (NodeData *)0x0) {
    pNVar10 = Parser::node(this,this->m_state);
    pNVar11 = Parser::node(this,this->m_root_id);
    if (pNVar10 != pNVar11) {
      pcVar14 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
      pcVar15 = msg;
      for (lVar13 = 0x4d; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pcVar15 = *pcVar14;
        pcVar14 = pcVar14 + (ulong)bVar16 * -2 + 1;
        pcVar15 = pcVar15 + (ulong)bVar16 * -2 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar17 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b0 = cVar17.len;
      auVar5 = ZEXT1224(ZEXT412(0x7762) << 0x40);
      LVar8.name.str._0_4_ = (int)cVar17.str;
      LVar8.super_LineCol.offset = auVar5._0_8_;
      LVar8.super_LineCol.line = auVar5._8_8_;
      LVar8.super_LineCol.col = auVar5._16_8_;
      LVar8.name.str._4_4_ = cVar17.str._4_4_;
      LVar8.name.len = local_b0;
      (*p_Var1)(msg,0x4d,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  if (as_child) {
    pNVar10 = Tree::_p(this->m_tree,node);
    if ((~(int)(pNVar10->m_type).type & 0x28U) != 0) {
      Tree::set_root_as_stream(this->m_tree);
    }
    this_00 = this->m_tree;
    pNVar10 = Tree::_p(this_00,node);
    i = pNVar10->m_last_child;
    if (node == 0xffffffffffffffff) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      cVar17 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4f;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg._24_4_ = cVar17.str._0_4_;
      msg._28_4_ = cVar17.str._4_4_;
      msg._32_2_ = (undefined2)cVar17.len;
      msg[0x22] = cVar17.len._2_1_;
      msg._35_5_ = cVar17.len._3_5_;
      (*(code *)PTR_error_impl_0022f4f8)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    pNVar10 = Tree::_p(this_00,node);
    if (((pNVar10->m_type).type & (STREAM|MAP)) == NOTYPE) {
      bVar9 = Tree::is_root(this_00,node);
      if (!bVar9) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar17 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4e;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_4_ = cVar17.str._0_4_;
        msg._28_4_ = cVar17.str._4_4_;
        msg._32_2_ = (undefined2)cVar17.len;
        msg[0x22] = cVar17.len._2_1_;
        msg._35_5_ = cVar17.len._3_5_;
        (*(code *)PTR_error_impl_0022f4f8)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (i != 0xffffffffffffffff) {
      pNVar10 = Tree::_p(this_00,i);
      if (pNVar10->m_parent != node) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar17 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4d;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_4_ = cVar17.str._0_4_;
        msg._28_4_ = cVar17.str._4_4_;
        msg._32_2_ = (undefined2)cVar17.len;
        msg[0x22] = cVar17.len._2_1_;
        msg._35_5_ = cVar17.len._3_5_;
        (*(code *)PTR_error_impl_0022f4f8)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(this_00);
    Tree::_set_hierarchy(this_00,ichild,node,i);
    this->m_state->node_id = ichild;
    Tree::to_doc(this->m_tree,ichild,0);
  }
  this->m_state->flags = this->m_state->flags | 0x1003;
  _handle_types(this);
  this->m_state->flags = this->m_state->flags & 0xffffefff;
  return;
}

Assistant:

void Parser::_start_doc(bool as_child)
{
    _c4dbgpf("start_doc (as child={})", as_child);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_root(parent_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        _c4dbgpf("start_doc: parent={}", parent_id);
        if( ! m_tree->is_stream(parent_id))
        {
            _c4dbgp("start_doc: rearranging with root as STREAM");
            m_tree->set_root_as_stream();
        }
        m_state->node_id = m_tree->append_child(parent_id);
        m_tree->to_doc(m_state->node_id);
    }
    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(parent_id) || m_tree->empty(parent_id));
        m_state->node_id = parent_id;
        if( ! m_tree->is_doc(parent_id))
        {
            m_tree->to_doc(parent_id, DOC);
        }
    }
    #endif
    _c4dbgpf("start_doc: id={}", m_state->node_id);
    add_flags(RUNK|RTOP|NDOC);
    _handle_types();
    rem_flags(NDOC);
}